

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hw_identifier_facade.cpp
# Opt level: O3

string * __thiscall
license::hw_identifier::HwIdentifierFacade::generate_user_pc_signature_abi_cxx11_
          (string *__return_storage_ptr__,HwIdentifierFacade *this,
          LCC_API_HW_IDENTIFICATION_STRATEGY strategy)

{
  int iVar1;
  LCC_API_HW_IDENTIFICATION_STRATEGY LVar2;
  char *__nptr;
  int *piVar3;
  logic_error *this_00;
  long *plVar4;
  long *plVar5;
  pointer *__ptr;
  LCC_API_HW_IDENTIFICATION_STRATEGY strategy_00;
  bool use_env_var;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar6;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar7;
  HwIdentifier pc_id;
  IdentificationStrategy local_98;
  HwIdentifier local_90;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  LVar2 = (LCC_API_HW_IDENTIFICATION_STRATEGY)this;
  if (LVar2 == STRATEGY_DEFAULT) {
    __nptr = getenv("IDENTIFICATION_STRATEGY");
    LVar2 = STRATEGY_DEFAULT;
    strategy_00 = STRATEGY_DEFAULT;
    if ((__nptr != (char *)0x0) && (*__nptr != '\0')) {
      LVar2 = atoi(__nptr);
      if ((uint)LVar2 < 4) {
        use_env_var = true;
        strategy_00 = LVar2;
      }
      else {
        piVar3 = __errno_location();
        uVar6 = extraout_XMM0_Da;
        uVar7 = extraout_XMM0_Db;
        if (*piVar3 != 0) {
          strerror(*piVar3);
          uVar6 = extraout_XMM0_Da_00;
          uVar7 = extraout_XMM0_Db_00;
        }
        use_env_var = false;
        _log((double)CONCAT44(uVar7,uVar6));
      }
      goto LAB_001891f9;
    }
  }
  use_env_var = false;
  strategy_00 = LVar2;
LAB_001891f9:
  IdentificationStrategy::get_strategy(&local_98,strategy_00);
  HwIdentifier::HwIdentifier(&local_90);
  iVar1 = (**(code **)(*local_98._vptr_IdentificationStrategy + 0x18))
                    (local_98._vptr_IdentificationStrategy,&local_90);
  HwIdentifier::set_use_environment_var(&local_90,use_env_var);
  if (iVar1 != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    iVar1 = (**(code **)(*local_98._vptr_IdentificationStrategy + 0x10))();
    std::__cxx11::to_string(&local_60,iVar1);
    std::operator+(&local_40,"strategy ",&local_60);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_80 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_80 == plVar5) {
      local_70 = *plVar5;
      lStack_68 = plVar4[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar5;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_80);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  HwIdentifier::print_abi_cxx11_(__return_storage_ptr__,&local_90);
  HwIdentifier::~HwIdentifier(&local_90);
  if (local_98._vptr_IdentificationStrategy != (_func_int **)0x0) {
    (**(code **)(*local_98._vptr_IdentificationStrategy + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HwIdentifierFacade::generate_user_pc_signature(LCC_API_HW_IDENTIFICATION_STRATEGY strategy) {
	bool use_env_var = false;
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategies_to_try;
	if (strategy == STRATEGY_DEFAULT) {
		char* env_var_value = getenv(LCC_IDENTIFICATION_STRATEGY_ENV_VAR);
		if (env_var_value != nullptr && env_var_value[0] != '\0') {
			int strategy_int = atoi(env_var_value);
			if (strategy_int < 0 || strategy_int > 3) {
				LOG_WARN("unknown " LCC_IDENTIFICATION_STRATEGY_ENV_VAR " %s", env_var_value);
			} else {
				strategy = (LCC_API_HW_IDENTIFICATION_STRATEGY)strategy_int;
				use_env_var = true;
			}
		}
	}

	unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strategy);
	HwIdentifier pc_id;
	FUNCTION_RETURN result = strategy_ptr->generate_pc_id(pc_id);
	pc_id.set_use_environment_var(use_env_var);
	if (result != FUNC_RET_OK) {
		throw logic_error("strategy " + to_string(strategy_ptr->identification_strategy()) + " failed");
	}
	return pc_id.print();
}